

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O0

void __thiscall Centaurus::IndexVector::IndexVector(IndexVector *this,size_type n,bool reserve_flag)

{
  size_type local_48;
  allocator<int> local_1a;
  byte local_19;
  size_type sStack_18;
  bool reserve_flag_local;
  size_type n_local;
  IndexVector *this_local;
  
  local_48 = n;
  if (reserve_flag) {
    local_48 = 0;
  }
  local_19 = reserve_flag;
  sStack_18 = n;
  n_local = (size_type)this;
  std::allocator<int>::allocator(&local_1a);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->super_vector<int,_std::allocator<int>_>,local_48,&local_1a);
  std::allocator<int>::~allocator(&local_1a);
  this->_vptr_IndexVector = (_func_int **)&PTR__IndexVector_002c0ce0;
  if ((local_19 & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::reserve
              (&this->super_vector<int,_std::allocator<int>_>,sStack_18);
  }
  return;
}

Assistant:

IndexVector(size_type n, bool reserve_flag = true)
        : std::vector<int>(reserve_flag ? 0 : n)
    {
        if (reserve_flag)
            reserve(n);
    }